

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

char * get_login(CHAR_DATA *ch,FILE *fpChar2)

{
  bool bVar1;
  int iVar2;
  FILE *in_RSI;
  char *word;
  char *login;
  bool end;
  bool fMatch;
  FILE *in_stack_00003fd8;
  int iVar3;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  char *astr;
  char *in_stack_ffffffffffffffd0;
  char *local_28;
  undefined6 in_stack_ffffffffffffffe0;
  byte bVar4;
  byte bVar5;
  char *local_8;
  
  bVar4 = 0;
  local_28 = (char *)0x0;
  if (in_RSI == (FILE *)0x0) {
    send_to_char(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_8 = "";
  }
  else {
    do {
      bVar5 = 0;
      iVar2 = feof(in_RSI);
      if (iVar2 == 0) {
        astr = fread_word((FILE *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_ffffffffffffffe0)));
      }
      else {
        astr = "End";
      }
      if ((*astr < 'a') || ('z' < *astr)) {
        iVar2 = (int)*astr;
      }
      else {
        iVar2 = *astr + -0x20;
      }
      iVar3 = iVar2;
      if (iVar2 == 0x45) {
        bVar1 = str_cmp(astr,"End");
        if (!bVar1) {
          bVar4 = 1;
        }
      }
      else if ((iVar2 == 0x4c) && (bVar1 = str_cmp(astr,"LogonTime"), !bVar1)) {
        local_28 = fread_string(in_stack_00003fd8);
        bVar5 = 1;
      }
      if ((bVar5 & 1) == 0) {
        fread_to_eol((FILE *)CONCAT44(iVar3,iVar2));
      }
    } while ((bVar4 & 1) == 0);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

char *get_login(CHAR_DATA *ch, FILE *fpChar2)
{
	bool fMatch, end = false;
	char *login = nullptr, *word;

	if (fpChar2 == nullptr)
	{
		send_to_char("Error opening pfile.\n\r", ch);
		return "";
	}

	for (;;)
	{
		fMatch = false;
		word = feof(fpChar2) ? (char *)"End" : fread_word(fpChar2);

		switch (UPPER(word[0]))
		{
			case 'E':
				if (!str_cmp(word, "End"))
				{
					end = true;
				}
				break;
			case 'L':
				KEY("LogonTime", login, fread_string(fpChar2))
				break;
		}

		if (!fMatch)
			fread_to_eol(fpChar2);

		if (end)
			break;
	}

	return login;
}